

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

unsigned_long_long ZSTD_findDecompressedSize(void *src,size_t srcSize)

{
  size_t sVar1;
  ulong uVar2;
  unsigned_long_long unaff_R12;
  unsigned_long_long uVar3;
  ulong uVar4;
  bool bVar5;
  bool bVar6;
  ZSTD_frameHeader local_58;
  
  if (srcSize < 5) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    do {
      if ((*src & 0xfffffff0) == 0x184d2a50) {
        bVar5 = true;
        if (srcSize < 8) {
          uVar2 = 0xffffffffffffffb8;
        }
        else {
          uVar2 = (ulong)*(uint *)((long)src + 4) + 8;
          if (srcSize < uVar2) {
LAB_0015b863:
            bVar5 = true;
            uVar2 = 0xfffffffffffffffe;
          }
          else {
            src = (void *)((long)src + uVar2);
            bVar5 = false;
            srcSize = srcSize - uVar2;
            uVar2 = unaff_R12;
          }
        }
      }
      else {
        bVar6 = false;
        sVar1 = ZSTD_getFrameHeader_advanced(&local_58,src,srcSize,ZSTD_f_zstd1);
        uVar2 = local_58.frameContentSize;
        if (local_58.frameType == ZSTD_skippableFrame) {
          uVar2 = 0;
        }
        if (sVar1 != 0) {
          uVar2 = 0xfffffffffffffffe;
        }
        if (uVar2 < 0xfffffffffffffffe) {
          uVar2 = uVar2 + uVar4;
          bVar6 = uVar4 <= uVar2;
          if (uVar4 < uVar2) {
            uVar4 = uVar2;
          }
          uVar2 = unaff_R12;
          if (!bVar6) {
            uVar2 = 0xfffffffffffffffe;
          }
        }
        bVar5 = true;
        if (bVar6) {
          sVar1 = ZSTD_findFrameCompressedSize(src,srcSize);
          if (0xffffffffffffff88 < sVar1) goto LAB_0015b863;
          src = (void *)((long)src + sVar1);
          srcSize = srcSize - sVar1;
          bVar5 = false;
        }
      }
      if (bVar5) {
        return uVar2;
      }
      unaff_R12 = uVar2;
    } while (4 < srcSize);
  }
  uVar3 = 0xfffffffffffffffe;
  if (srcSize == 0) {
    uVar3 = uVar4;
  }
  return uVar3;
}

Assistant:

unsigned long long ZSTD_findDecompressedSize(const void* src, size_t srcSize)
{
    unsigned long long totalDstSize = 0;

    while (srcSize >= ZSTD_frameHeaderSize_prefix) {
        U32 const magicNumber = MEM_readLE32(src);

        if ((magicNumber & 0xFFFFFFF0U) == ZSTD_MAGIC_SKIPPABLE_START) {
            size_t skippableSize;
            if (srcSize < ZSTD_skippableHeaderSize)
                return ERROR(srcSize_wrong);
            skippableSize = MEM_readLE32((const BYTE *)src + ZSTD_frameIdSize)
                          + ZSTD_skippableHeaderSize;
            if (srcSize < skippableSize) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + skippableSize;
            srcSize -= skippableSize;
            continue;
        }

        {   unsigned long long const ret = ZSTD_getFrameContentSize(src, srcSize);
            if (ret >= ZSTD_CONTENTSIZE_ERROR) return ret;

            /* check for overflow */
            if (totalDstSize + ret < totalDstSize) return ZSTD_CONTENTSIZE_ERROR;
            totalDstSize += ret;
        }
        {   size_t const frameSrcSize = ZSTD_findFrameCompressedSize(src, srcSize);
            if (ZSTD_isError(frameSrcSize)) {
                return ZSTD_CONTENTSIZE_ERROR;
            }

            src = (const BYTE *)src + frameSrcSize;
            srcSize -= frameSrcSize;
        }
    }  /* while (srcSize >= ZSTD_frameHeaderSize_prefix) */

    if (srcSize) return ZSTD_CONTENTSIZE_ERROR;

    return totalDstSize;
}